

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathCompAdditiveExpr(xmlXPathParserContextPtr ctxt)

{
  int ch1;
  bool bVar1;
  uint local_14;
  int op1;
  int plus;
  xmlXPathParserContextPtr ctxt_local;
  
  xmlXPathCompMultiplicativeExpr(ctxt);
  if (ctxt->error == 0) {
    while( true ) {
      bVar1 = true;
      if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar1 = true, 10 < *ctxt->cur)))) {
        bVar1 = *ctxt->cur == '\r';
      }
      if (!bVar1) break;
      if (*ctxt->cur != '\0') {
        ctxt->cur = ctxt->cur + 1;
      }
    }
    while( true ) {
      bVar1 = true;
      if (*ctxt->cur != '+') {
        bVar1 = *ctxt->cur == '-';
      }
      if (!bVar1) break;
      ch1 = ctxt->comp->last;
      local_14 = (uint)(*ctxt->cur == '+');
      if (*ctxt->cur != '\0') {
        ctxt->cur = ctxt->cur + 1;
      }
      while( true ) {
        bVar1 = true;
        if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar1 = true, 10 < *ctxt->cur)))) {
          bVar1 = *ctxt->cur == '\r';
        }
        if (!bVar1) break;
        if (*ctxt->cur != '\0') {
          ctxt->cur = ctxt->cur + 1;
        }
      }
      xmlXPathCompMultiplicativeExpr(ctxt);
      if (ctxt->error != 0) {
        return;
      }
      xmlXPathCompExprAdd(ctxt,ch1,ctxt->comp->last,XPATH_OP_PLUS,local_14,0,0,(void *)0x0,
                          (void *)0x0);
      while( true ) {
        bVar1 = true;
        if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar1 = true, 10 < *ctxt->cur)))) {
          bVar1 = *ctxt->cur == '\r';
        }
        if (!bVar1) break;
        if (*ctxt->cur != '\0') {
          ctxt->cur = ctxt->cur + 1;
        }
      }
    }
  }
  return;
}

Assistant:

static void
xmlXPathCompAdditiveExpr(xmlXPathParserContextPtr ctxt) {

    xmlXPathCompMultiplicativeExpr(ctxt);
    CHECK_ERROR;
    SKIP_BLANKS;
    while ((CUR == '+') || (CUR == '-')) {
	int plus;
	int op1 = ctxt->comp->last;

        if (CUR == '+') plus = 1;
	else plus = 0;
	NEXT;
	SKIP_BLANKS;
        xmlXPathCompMultiplicativeExpr(ctxt);
	CHECK_ERROR;
	PUSH_BINARY_EXPR(XPATH_OP_PLUS, op1, ctxt->comp->last, plus, 0);
	SKIP_BLANKS;
    }
}